

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void rdft(int n,int isgn,double *a,int *ip,double *w)

{
  double dVar1;
  int nw_00;
  int nc_00;
  int nc;
  int nw;
  double xi;
  double *w_local;
  int *ip_local;
  double *a_local;
  int isgn_local;
  int n_local;
  
  nw_00 = *ip;
  nc_00 = ip[1];
  if (isgn < 0) {
    a[1] = (*a - a[1]) * 0.5;
    *a = *a - a[1];
    if (n < 5) {
      if (n == 4) {
        cftbsub(4,a,ip,nw_00,w);
      }
    }
    else {
      rftbsub(n,a,nc_00,w + nw_00);
      cftbsub(n,a,ip,nw_00,w);
    }
  }
  else {
    if (n < 5) {
      if (n == 4) {
        cftfsub(4,a,ip,nw_00,w);
      }
    }
    else {
      cftfsub(n,a,ip,nw_00,w);
      rftfsub(n,a,nc_00,w + nw_00);
    }
    dVar1 = *a;
    *a = a[1] + *a;
    a[1] = dVar1 - a[1];
  }
  return;
}

Assistant:

void rdft(int n, int isgn, double *a, int *ip, double *w) {
  void cftfsub(int n, double *a, int *ip, int nw, double *w);
  void cftbsub(int n, double *a, int *ip, int nw, double *w);
  void rftfsub(int n, double *a, int nc, double *c);
  void rftbsub(int n, double *a, int nc, double *c);
  double xi;

  int nw = ip[0];
  int nc = ip[1];

  if (isgn >= 0) {
    if (n > 4) {
      cftfsub(n, a, ip, nw, w);
      rftfsub(n, a, nc, w + nw);
    } else if (n == 4) {
      cftfsub(n, a, ip, nw, w);
    }
    xi = a[0] - a[1];
    a[0] += a[1];
    a[1] = xi;
  } else {
    a[1] = 0.5 * (a[0] - a[1]);
    a[0] -= a[1];
    if (n > 4) {
      rftbsub(n, a, nc, w + nw);
      cftbsub(n, a, ip, nw, w);
    } else if (n == 4) {
      cftbsub(n, a, ip, nw, w);
    }
  }
}